

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_animatable_default<bool>
                   (string *__return_storage_ptr__,Animatable<bool> *v,uint32_t indent)

{
  stringstream ss;
  allocator local_199;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  if (v->_blocked == true) {
    ::std::operator<<(local_188,"None");
  }
  if (v->_has_value == true) {
    if (v->_blocked != false) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]",&local_199);
      goto LAB_002580f0;
    }
    ::std::ostream::_M_insert<bool>(SUB81(local_188,0));
  }
  ::std::__cxx11::stringbuf::str();
LAB_002580f0:
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}